

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

string * __thiscall
arangodb::velocypack::Builder::toString_abi_cxx11_(string *__return_storage_ptr__,Builder *this)

{
  Slice slice;
  StringSink sink;
  Options local_50;
  Sink local_20;
  string *local_18;
  
  local_50.unsupportedTypeBehavior = FailOnUnsupportedType;
  local_50.paddingBehavior = Flexible;
  local_50.attributeTranslator = (AttributeTranslator *)0x0;
  local_50.customTypeHandler._0_5_ = 0;
  local_50.customTypeHandler._5_3_ = 0;
  local_50.buildUnindexedArrays = false;
  local_50.buildUnindexedObjects = false;
  local_50.singleLinePrettyPrint = false;
  local_50.keepTopLevelOpen = false;
  local_50.clearBuilderBeforeParse = true;
  local_50.validateUtf8Strings = false;
  local_50.checkAttributeUniqueness = false;
  local_50.escapeForwardSlashes = false;
  local_50.escapeControl = true;
  local_50.escapeUnicode = false;
  local_50.dumpAttributesInIndexOrder = true;
  local_50.unsupportedDoublesAsString = false;
  local_50.binaryAsHex = false;
  local_50.datesAsIntegers = false;
  local_50.disallowExternals = false;
  local_50.disallowCustom = false;
  local_50.disallowTags = false;
  local_50.disallowBCD = false;
  local_50.debugTags = false;
  local_50.nestingLimit = 0xffffffff;
  local_50.prettyPrint = true;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_20._vptr_Sink = (_func_int **)&PTR__Sink_00119c90;
  local_18 = __return_storage_ptr__;
  slice = Builder::slice(this);
  Dumper::dump(slice,&local_20,&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Builder::toString() const {
  Options opts;
  opts.prettyPrint = true;

  std::string buffer;
  StringSink sink(&buffer);
  Dumper::dump(slice(), &sink, &opts);
  return buffer;
}